

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbolNoPlaceholder
          (DescriptorBuilder *this,string_view name,string_view relative_to,ResolveMode resolve_mode
          ,bool build_it)

{
  uint uVar1;
  Symbol SVar2;
  void *pvVar3;
  ulong uVar4;
  char *__s;
  size_t __n;
  ulong uVar5;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string scope_to_try;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ResolveMode local_9c;
  string *local_98;
  AlphaNum local_90;
  AlphaNum local_60;
  
  __s = name._M_str;
  __n = name._M_len;
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  (this->undefine_resolved_name_)._M_string_length = 0;
  *(this->undefine_resolved_name_)._M_dataplus._M_p = '\0';
  uVar5 = 0;
  local_9c = resolve_mode;
  if (__n != 0) {
    if (*__s == '.') {
      name_00._M_len = __n - 1;
      name_00._M_str = __s + 1;
      SVar2 = FindSymbol(this,name_00,build_it);
      return (Symbol)SVar2.ptr_;
    }
    pvVar3 = memchr(__s,0x2e,__n);
    uVar4 = (long)pvVar3 - (long)__s;
    uVar5 = __n;
    if ((uVar4 != 0xffffffffffffffff && pvVar3 != (void *)0x0) && (uVar5 = uVar4, __n < uVar4)) {
      uVar5 = __n;
    }
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,relative_to._M_str,relative_to._M_str + relative_to._M_len);
  uVar4 = std::__cxx11::string::rfind((char)&local_c0,0x2e);
  if (uVar4 != 0xffffffffffffffff) {
    local_98 = (string *)&this->undefine_resolved_name_;
    do {
      if (local_c0._M_string_length < uVar4) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   uVar4);
      }
      local_c0._M_dataplus._M_p[uVar4] = '\0';
      local_90.piece_._M_len = 1;
      local_90.piece_._M_str = ".";
      local_c0._M_string_length = uVar4;
      local_60.piece_._M_len = uVar5;
      local_60.piece_._M_str = __s;
      absl::lts_20250127::StrAppend(&local_c0,&local_90,&local_60);
      name_01._M_str = local_c0._M_dataplus._M_p;
      name_01._M_len = local_c0._M_string_length;
      SVar2 = FindSymbol(this,name_01,build_it);
      if ((SVar2.ptr_)->symbol_type_ != 0) {
        uVar1 = (uint)(SVar2.ptr_)->symbol_type_;
        if (__n < uVar5 || __n - uVar5 == 0) {
          if (((local_9c != LOOKUP_TYPES) || (uVar1 == 1)) || (uVar1 == 4)) goto LAB_00161e0f;
        }
        else if ((uVar1 < 0xb) && ((0x692U >> (uVar1 & 0x1f) & 1) != 0)) {
          local_90.piece_._M_str = __s + uVar5;
          local_90.piece_._M_len = __n - uVar5;
          absl::lts_20250127::StrAppend(&local_c0,&local_90);
          name_02._M_str = local_c0._M_dataplus._M_p;
          name_02._M_len = local_c0._M_string_length;
          SVar2 = FindSymbol(this,name_02,build_it);
          if ((SVar2.ptr_)->symbol_type_ == '\0') {
            std::__cxx11::string::_M_assign(local_98);
          }
          goto LAB_00161e0f;
        }
      }
      if (local_c0._M_string_length < uVar4) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   uVar4);
      }
      local_c0._M_dataplus._M_p[uVar4] = '\0';
      local_c0._M_string_length = uVar4;
      uVar4 = std::__cxx11::string::rfind((char)&local_c0,0x2e);
    } while (uVar4 != 0xffffffffffffffff);
  }
  SVar2 = FindSymbol(this,name,build_it);
LAB_00161e0f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return (Symbol)SVar2.ptr_;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbolNoPlaceholder(
    const absl::string_view name, const absl::string_view relative_to,
    ResolveMode resolve_mode, bool build_it) {
  possible_undeclared_dependency_ = nullptr;
  undefine_resolved_name_.clear();

  if (!name.empty() && name[0] == '.') {
    // Fully-qualified name.
    return FindSymbol(name.substr(1), build_it);
  }

  // If name is something like "Foo.Bar.baz", and symbols named "Foo" are
  // defined in multiple parent scopes, we only want to find "Bar.baz" in the
  // innermost one.  E.g., the following should produce an error:
  //   message Bar { message Baz {} }
  //   message Foo {
  //     message Bar {
  //     }
  //     optional Bar.Baz baz = 1;
  //   }
  // So, we look for just "Foo" first, then look for "Bar.baz" within it if
  // found.
  std::string::size_type name_dot_pos = name.find_first_of('.');
  absl::string_view first_part_of_name;
  if (name_dot_pos == std::string::npos) {
    first_part_of_name = name;
  } else {
    first_part_of_name = name.substr(0, name_dot_pos);
  }

  std::string scope_to_try(relative_to);

  while (true) {
    // Chop off the last component of the scope.
    std::string::size_type dot_pos = scope_to_try.find_last_of('.');
    if (dot_pos == std::string::npos) {
      return FindSymbol(name, build_it);
    } else {
      scope_to_try.erase(dot_pos);
    }

    // Append ".first_part_of_name" and try to find.
    std::string::size_type old_size = scope_to_try.size();
    absl::StrAppend(&scope_to_try, ".", first_part_of_name);
    Symbol result = FindSymbol(scope_to_try, build_it);
    if (!result.IsNull()) {
      if (first_part_of_name.size() < name.size()) {
        // name is a compound symbol, of which we only found the first part.
        // Now try to look up the rest of it.
        if (result.IsAggregate()) {
          absl::StrAppend(&scope_to_try,
                          name.substr(first_part_of_name.size()));
          result = FindSymbol(scope_to_try, build_it);
          if (result.IsNull()) {
            undefine_resolved_name_ = scope_to_try;
          }
          return result;
        } else {
          // We found a symbol but it's not an aggregate.  Continue the loop.
        }
      } else {
        if (resolve_mode == LOOKUP_TYPES && !result.IsType()) {
          // We found a symbol but it's not a type.  Continue the loop.
        } else {
          return result;
        }
      }
    }

    // Not found.  Remove the name so we can try again.
    scope_to_try.erase(old_size);
  }
}